

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

Maybe<kj::Array<unsigned_char>_> * __thiscall
kj::Exception::releaseDetail
          (Maybe<kj::Array<unsigned_char>_> *__return_storage_ptr__,Exception *this,
          DetailTypeId typeId)

{
  Detail *pDVar1;
  DetailTypeId DVar2;
  uchar *puVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  RemoveConst<kj::Exception::Detail> *pRVar6;
  uchar *puVar7;
  size_t sVar8;
  ArrayDisposer *pAVar9;
  Detail *pDVar10;
  bool bVar11;
  Array<unsigned_char> result;
  
  pDVar10 = (this->details).builder.ptr;
  pDVar1 = (this->details).builder.pos;
  bVar11 = pDVar10 == pDVar1;
  if (!bVar11) {
    DVar2 = pDVar10->id;
    while (DVar2 != typeId) {
      pDVar10 = pDVar10 + 1;
      bVar11 = pDVar10 == pDVar1;
      if (bVar11) goto LAB_004c99c6;
      DVar2 = pDVar10->id;
    }
    puVar3 = (pDVar10->value).ptr;
    sVar4 = (pDVar10->value).size_;
    pAVar5 = (pDVar10->value).disposer;
    (pDVar10->value).ptr = (uchar *)0x0;
    (pDVar10->value).size_ = 0;
    pRVar6 = (this->details).builder.pos;
    if (pDVar10 != pRVar6 + -1) {
      pDVar10->id = pRVar6[-1].id;
      puVar7 = (pDVar10->value).ptr;
      if (puVar7 != (uchar *)0x0) {
        sVar8 = (pDVar10->value).size_;
        (pDVar10->value).ptr = (uchar *)0x0;
        (pDVar10->value).size_ = 0;
        pAVar9 = (pDVar10->value).disposer;
        (**pAVar9->_vptr_ArrayDisposer)(pAVar9,puVar7,1,sVar8,sVar8,0);
      }
      (pDVar10->value).ptr = pRVar6[-1].value.ptr;
      (pDVar10->value).size_ = pRVar6[-1].value.size_;
      (pDVar10->value).disposer = pRVar6[-1].value.disposer;
      pRVar6[-1].value.ptr = (uchar *)0x0;
      pRVar6[-1].value.size_ = 0;
    }
    ArrayBuilder<kj::Exception::Detail>::removeLast(&(this->details).builder);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.ptr = puVar3;
    (__return_storage_ptr__->ptr).field_1.value.size_ = sVar4;
    (__return_storage_ptr__->ptr).field_1.value.disposer = pAVar5;
    if (!bVar11) {
      return __return_storage_ptr__;
    }
  }
LAB_004c99c6:
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<byte>> Exception::releaseDetail(DetailTypeId typeId) {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      kj::Array<byte> result = kj::mv(detail.value);
      if (&detail != &details.back()) {
        detail = kj::mv(details.back());
      }
      details.removeLast();
      return kj::mv(result);
    }
  }
  return kj::none;
}